

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O1

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::calcIndicator
          (AbstractScrollAreaPrivate *this,Orientation orient,int minSize,int width,bool *needPaint,
          int *indicatorSize,QPoint *indicatorPos)

{
  QWidget *pQVar1;
  long lVar2;
  QWidget *pQVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (orient == Vertical) {
    pQVar1 = this->viewport;
    lVar2 = *(long *)(pQVar1 + 0x20);
    iVar7 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
    iVar6 = (this->scrolledAreaSize).ht;
    uVar5 = (ulong)(uint)(width * 2);
    iVar4 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
    iVar9 = (this->scrolledAreaSize).wd;
    if (iVar9 <= iVar4) {
      iVar4 = iVar9;
    }
    pQVar3 = *(QWidget **)(*(long *)&this->vertIndicator->field_0x8 + 0x10);
    iVar9 = 0;
    if (pQVar3 != pQVar1) {
      iVar9 = (this->topLeftCorner).xp;
    }
    dVar10 = (double)iVar6;
    uVar8 = iVar4 + width * -2 + iVar9;
    if (iVar7 < iVar6) {
      iVar6 = iVar7;
    }
    iVar6 = iVar6 + width * -4;
    if ((double)iVar7 / dVar10 < 1.0) {
      dVar12 = ((double)iVar7 / dVar10) * (double)iVar6;
      iVar4 = (int)dVar12;
      dVar11 = (double)(this->topLeftCorner).yp / dVar10;
      iVar9 = iVar4;
      if (iVar4 <= minSize) {
        iVar9 = minSize;
      }
      dVar13 = dVar11;
      if (iVar4 < minSize) {
        dVar13 = ((double)(int)dVar12 / (double)minSize) * dVar11;
      }
      *indicatorSize = iVar9;
      dVar12 = 0.0;
      if (pQVar3 != pQVar1) {
        dVar12 = dVar10;
      }
      uVar5 = (ulong)(uint)(int)((double)(width * 2) + (double)iVar6 * dVar13 + dVar12 * dVar11);
      goto LAB_00156b8f;
    }
  }
  else {
    if (orient != Horizontal) {
      return;
    }
    pQVar1 = this->viewport;
    lVar2 = *(long *)(pQVar1 + 0x20);
    iVar7 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
    iVar6 = (this->scrolledAreaSize).wd;
    uVar8 = width * 2;
    iVar4 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
    iVar9 = (this->scrolledAreaSize).ht;
    if (iVar9 <= iVar4) {
      iVar4 = iVar9;
    }
    pQVar3 = *(QWidget **)(*(long *)&this->horIndicator->field_0x8 + 0x10);
    iVar9 = 0;
    if (pQVar3 != pQVar1) {
      iVar9 = (this->topLeftCorner).yp;
    }
    dVar10 = (double)iVar6;
    uVar5 = (ulong)(uint)(iVar4 + width * -2 + iVar9);
    if (iVar7 < iVar6) {
      iVar6 = iVar7;
    }
    iVar6 = iVar6 + width * -4;
    if ((double)iVar7 / dVar10 < 1.0) {
      dVar12 = ((double)iVar7 / dVar10) * (double)iVar6;
      iVar4 = (int)dVar12;
      dVar11 = (double)(this->topLeftCorner).xp / dVar10;
      iVar9 = iVar4;
      if (iVar4 <= minSize) {
        iVar9 = minSize;
      }
      dVar13 = dVar11;
      if (iVar4 < minSize) {
        dVar13 = ((double)(int)dVar12 / (double)minSize) * dVar11;
      }
      *indicatorSize = iVar9;
      dVar12 = 0.0;
      if (pQVar3 != pQVar1) {
        dVar12 = dVar10;
      }
      uVar8 = (uint)((double)(int)uVar8 + (double)iVar6 * dVar13 + dVar12 * dVar11);
      goto LAB_00156b8f;
    }
  }
  *needPaint = false;
  *indicatorSize = iVar6;
LAB_00156b8f:
  *indicatorPos = (QPoint)((ulong)uVar8 | uVar5 << 0x20);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::calcIndicator( Qt::Orientation orient,
	int minSize, int width, bool & needPaint,
	int & indicatorSize, QPoint & indicatorPos )
{
	int viewportSize = 0;
	int scrolledSize = 0;
	int x = 0;
	int y = 0;
	double posRatio = 0.0;
	int totalIndicatorSize = 0;
	double ratio = 0.0;
	double deltaRatio = 0.0;

	switch( orient )
	{
		case Qt::Horizontal :
		{
			viewportSize = viewport->width();
			scrolledSize = scrolledAreaSize.width();
			x = 2 * width;
			y = qMin( viewport->height(), scrolledAreaSize.height() ) - x;
			y += ( horIndicator->parent() == viewport ? 0 : topLeftCorner.y() );
			posRatio = (double) topLeftCorner.x() / (double) scrolledSize;
			totalIndicatorSize = qMin( viewportSize, scrolledSize ) - 4 * width;
			ratio = (double) viewportSize / (double) scrolledSize;
			deltaRatio = posRatio;

			if( ratio < 1.0 )
			{
				indicatorSize = (double) totalIndicatorSize * ratio;

				if( indicatorSize < minSize )
				{
					deltaRatio *= ( (double) indicatorSize / (double) minSize );
					indicatorSize = minSize;
				}

				x += totalIndicatorSize * deltaRatio
					+ ( horIndicator->parent() == viewport ? 0 : scrolledSize )
					* posRatio;
			}
			else
			{
				needPaint = false;
				indicatorSize = totalIndicatorSize;
			}

			indicatorPos = QPoint( x, y );
		}
		break;

		case Qt::Vertical :
		{
			viewportSize = viewport->height();
			scrolledSize = scrolledAreaSize.height();
			y = 2 * width;
			x = qMin( viewport->width(), scrolledAreaSize.width() ) - y;
			x += ( vertIndicator->parent() == viewport ? 0 : topLeftCorner.x() );
			posRatio = (double) topLeftCorner.y() / (double) scrolledSize;
			totalIndicatorSize = qMin( viewportSize, scrolledSize ) - 4 * width;
			ratio = (double) viewportSize / (double) scrolledSize;
			deltaRatio = posRatio;

			if( ratio < 1.0 )
			{
				indicatorSize = (double) totalIndicatorSize * ratio;

				if( indicatorSize < minSize )
				{
					deltaRatio *= ( (double) indicatorSize / (double) minSize );
					indicatorSize = minSize;
				}

				y += totalIndicatorSize * deltaRatio
					+ ( vertIndicator->parent() == viewport ? 0 : scrolledSize )
					* posRatio;
			}
			else
			{
				needPaint = false;
				indicatorSize = totalIndicatorSize;
			}

			indicatorPos = QPoint( x, y );
		}
		break;
	}
}